

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

int64_t flatbuffers::GetAnyValueI(BaseType type,uint8_t *data)

{
  byte bVar1;
  char cVar2;
  short sVar3;
  unsigned_short uVar4;
  int iVar5;
  uint uVar6;
  char *s_00;
  float fVar7;
  double dVar8;
  ulong local_38;
  String *s;
  uint8_t *data_local;
  ulong uStack_10;
  BaseType type_local;
  
  switch(type) {
  case UType:
  case Bool:
  case UByte:
    bVar1 = ReadScalar<unsigned_char>(data);
    uStack_10 = (ulong)bVar1;
    break;
  case Byte:
    cVar2 = ReadScalar<signed_char>(data);
    uStack_10 = (ulong)cVar2;
    break;
  case Short:
    sVar3 = ReadScalar<short>(data);
    uStack_10 = (ulong)sVar3;
    break;
  case UShort:
    uVar4 = ReadScalar<unsigned_short>(data);
    uStack_10 = (ulong)uVar4;
    break;
  case Int:
    iVar5 = ReadScalar<int>(data);
    uStack_10 = (ulong)iVar5;
    break;
  case UInt:
    uVar6 = ReadScalar<unsigned_int>(data);
    uStack_10 = (ulong)uVar6;
    break;
  case Long:
    uStack_10 = ReadScalar<long>(data);
    break;
  case ULong:
    uStack_10 = ReadScalar<unsigned_long>(data);
    break;
  case Float:
    fVar7 = ReadScalar<float>(data);
    uStack_10 = (ulong)fVar7;
    break;
  case Double:
    dVar8 = ReadScalar<double>(data);
    uStack_10 = (ulong)dVar8;
    break;
  case String:
    uVar6 = ReadScalar<unsigned_int>(data);
    if ((String *)(data + uVar6) == (String *)0x0) {
      local_38 = 0;
    }
    else {
      s_00 = String::c_str((String *)(data + uVar6));
      local_38 = StringToInt(s_00,10);
    }
    uStack_10 = local_38;
    break;
  default:
    uStack_10 = 0;
  }
  return uStack_10;
}

Assistant:

int64_t GetAnyValueI(reflection::BaseType type, const uint8_t *data) {
  // clang-format off
  #define FLATBUFFERS_GET(T) static_cast<int64_t>(ReadScalar<T>(data))
  switch (type) {
    case reflection::UType:
    case reflection::Bool:
    case reflection::UByte:  return FLATBUFFERS_GET(uint8_t);
    case reflection::Byte:   return FLATBUFFERS_GET(int8_t);
    case reflection::Short:  return FLATBUFFERS_GET(int16_t);
    case reflection::UShort: return FLATBUFFERS_GET(uint16_t);
    case reflection::Int:    return FLATBUFFERS_GET(int32_t);
    case reflection::UInt:   return FLATBUFFERS_GET(uint32_t);
    case reflection::Long:   return FLATBUFFERS_GET(int64_t);
    case reflection::ULong:  return FLATBUFFERS_GET(uint64_t);
    case reflection::Float:  return FLATBUFFERS_GET(float);
    case reflection::Double: return FLATBUFFERS_GET(double);
    case reflection::String: {
      auto s = reinterpret_cast<const String *>(ReadScalar<uoffset_t>(data) +
                                                data);
      return s ? StringToInt(s->c_str()) : 0;
    }
    default: return 0;  // Tables & vectors do not make sense.
  }
  #undef FLATBUFFERS_GET
  // clang-format on
}